

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathCountFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr *ppxVar1;
  xmlXPathObjectPtr pxVar2;
  xmlXPathObjectPtr value;
  uint uVar3;
  int iVar4;
  double val;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    iVar4 = ctxt->valueNr;
    if ((long)iVar4 < 1) {
      iVar4 = 0x17;
    }
    else {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) &&
         ((ctxt->value->type | XPATH_USERS) == XPATH_XSLT_TREE)) {
        uVar3 = iVar4 - 1;
        ctxt->valueNr = uVar3;
        ppxVar1 = ctxt->valueTab;
        if (iVar4 == 1) {
          pxVar2 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar2 = ppxVar1[(long)iVar4 + -2];
        }
        ctxt->value = pxVar2;
        pxVar2 = ppxVar1[uVar3];
        ppxVar1[uVar3] = (xmlXPathObjectPtr)0x0;
        if ((pxVar2 == (xmlXPathObjectPtr)0x0) || (pxVar2->nodesetval == (xmlNodeSetPtr)0x0)) {
          val = 0.0;
        }
        else {
          val = (double)pxVar2->nodesetval->nodeNr;
        }
        value = xmlXPathCacheNewFloat(ctxt,val);
        xmlXPathValuePush(ctxt,value);
        xmlXPathReleaseObject(ctxt->context,pxVar2);
        return;
      }
      iVar4 = 0xb;
    }
  }
  else {
    iVar4 = 0xc;
  }
  xmlXPathErr(ctxt,iVar4);
  return;
}

Assistant:

void
xmlXPathCountFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur == NULL) || (cur->nodesetval == NULL))
	xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt, 0.0));
    else
	xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt,
	    (double) cur->nodesetval->nodeNr));
    xmlXPathReleaseObject(ctxt->context, cur);
}